

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int linklist_5_3::get_common_arr(int *a,int n1,int *b,int n2)

{
  code *pcVar1;
  LinkList list_00;
  node *pnVar2;
  LinkList q;
  LinkList p;
  LinkList list;
  int local_28;
  int j;
  int i;
  int n2_local;
  int *b_local;
  int n1_local;
  int *a_local;
  
  local_28 = 0;
  list._4_4_ = 0;
  list_00 = (LinkList)malloc(0x10);
  list_00->next = (node *)0x0;
  while (local_28 < n1 && list._4_4_ < n2) {
    if (a[local_28] == b[list._4_4_]) {
      pnVar2 = (node *)malloc(0x10);
      pnVar2->data = a[local_28];
      pnVar2->next = list_00->next;
      list_00->next = pnVar2;
      local_28 = local_28 + 1;
      list._4_4_ = list._4_4_ + 1;
    }
    else if (a[local_28] < b[list._4_4_]) {
      local_28 = local_28 + 1;
    }
    else {
      list._4_4_ = list._4_4_ + 1;
    }
  }
  ps_link_list(list_00);
  ps_link_list(list_00);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int get_common_arr(int *a, int n1, int *b, int n2) {
        int i = 0, j = 0;
        LinkList list = newNode, p, q;
        list->next = nullptr;
        q = list;
        while (i < n1 && j < n2) {
            if (a[i] == b[j]) {
                p = newNode;
                p->data = a[i];
//                q->next = p;
//                q = p;
                p->next = q->next;
                q->next = p;
                i++;
                j++;
            } else if (a[i] < b[j]) {
                i++;
            } else {
                j++;
            }
        }
        ps_link_list(list);
        ps_link_list(q);
    }